

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_value_basic(void)

{
  _Bool _Var1;
  byte bVar2;
  bson_subtype_t bVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bson_t *pbVar9;
  undefined8 uVar10;
  bson_t *pbVar11;
  undefined8 uVar12;
  uint8_t *puVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bson_oid_t *pbVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int64_t iVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  char *pcVar22;
  char *pcVar23;
  undefined8 uVar24;
  char *pcVar25;
  bson_oid_t *pbVar26;
  undefined8 uVar27;
  char *pcVar28;
  undefined8 uVar29;
  char *pcVar30;
  undefined8 uVar31;
  char *pcVar32;
  bson_t *pbVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  double dVar36;
  int i;
  _Bool r;
  bson_t sub;
  bson_t *doc;
  bson_t other;
  bson_oid_t oid;
  bson_iter_t iter;
  bson_value_t copy;
  bson_value_t *value;
  int local_388;
  bson_t local_380;
  undefined8 local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined1 local_278;
  bson_oid_t local_18c;
  undefined1 local_180 [160];
  undefined1 local_e0 [32];
  long local_c0;
  
  memset(&local_280,0,0x80);
  local_280 = 3;
  local_27c = 5;
  local_278 = 5;
  memset(&local_380,0,0x80);
  local_380.flags = 3;
  local_380.len = 5;
  local_380.padding[0] = '\x05';
  bson_oid_init(&local_18c,0);
  uVar7 = bson_bcon_magic();
  dVar36 = bcon_ensure_double(123.4);
  uVar8 = bson_bcon_magic();
  pbVar9 = bcon_ensure_const_bson_ptr(&local_380);
  uVar10 = bson_bcon_magic();
  pbVar11 = bcon_ensure_const_bson_ptr(&local_380);
  uVar12 = bson_bcon_magic();
  bVar3 = bcon_ensure_subtype(BSON_SUBTYPE_BINARY);
  puVar13 = bcon_ensure_const_uint8_ptr("");
  uVar4 = bcon_ensure_uint32(0x10);
  uVar14 = bson_bcon_magic();
  uVar15 = bson_bcon_magic();
  pbVar16 = bcon_ensure_const_oid_ptr(&local_18c);
  uVar17 = bson_bcon_magic();
  _Var1 = bcon_ensure_bool(true);
  uVar18 = bson_bcon_magic();
  iVar19 = bcon_ensure_int64(0xbc614e);
  uVar20 = bson_bcon_magic();
  uVar21 = bson_bcon_magic();
  pcVar22 = bcon_ensure_const_char_ptr("^hello");
  pcVar23 = bcon_ensure_const_char_ptr("i");
  uVar24 = bson_bcon_magic();
  pcVar25 = bcon_ensure_const_char_ptr("test.test");
  pbVar26 = bcon_ensure_const_oid_ptr(&local_18c);
  uVar27 = bson_bcon_magic();
  pcVar28 = bcon_ensure_const_char_ptr("var a = function() {}");
  uVar29 = bson_bcon_magic();
  pcVar30 = bcon_ensure_const_char_ptr("my_symbol");
  uVar31 = bson_bcon_magic();
  pcVar32 = bcon_ensure_const_char_ptr("var a = 1;");
  pbVar33 = bcon_ensure_const_bson_ptr(&local_380);
  uVar34 = bson_bcon_magic();
  iVar5 = bcon_ensure_int32(0x4d2);
  uVar35 = bson_bcon_magic();
  iVar6 = bcon_ensure_int32(0x4d2);
  bcon_ensure_int32(0x11d7);
  bson_bcon_magic();
  bcon_ensure_int32(0x10e1);
  bson_bcon_magic();
  bson_bcon_magic();
  local_288 = bcon_new(dVar36,0,"double",uVar7,1,"utf8","this is my string","document",uVar8,2,
                       pbVar9,"array",uVar10,2,pbVar11,"binary",uVar12,4,bVar3,puVar13,uVar4,
                       "undefined",uVar14,5,"oid",uVar15,6,pbVar16,"bool",uVar17,7,_Var1,"datetime",
                       uVar18,8,iVar19,"null",uVar20,9,"regex",uVar21,10,pcVar22,pcVar23,"dbpointer"
                       ,uVar24,0xb,pcVar25,pbVar26,"code",uVar27,0xc,pcVar28,"symbol",uVar29,0xd,
                       pcVar30,"codewscope",uVar31,0xe,pcVar32,pbVar33,"int32",uVar34,0xf,iVar5,
                       "timestamp",uVar35,0x10,iVar6);
  bVar2 = bson_iter_init(local_180,local_288);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
            ,0x52,"test_value_basic","r");
    abort();
  }
  local_388 = 0;
  while( true ) {
    if (0x13 < local_388) {
      bVar2 = bson_iter_next(local_180);
      if (((bVar2 & 1 ^ 0xff) & 1) == 0) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
                ,100,"test_value_basic","!r");
        abort();
      }
      bson_destroy(local_288);
      bson_destroy(&local_280);
      return;
    }
    bVar2 = bson_iter_next(local_180);
    if ((bVar2 & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
              ,0x56,"test_value_basic","r");
      abort();
    }
    local_c0 = bson_iter_value(local_180);
    if (local_c0 == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
              ,0x59,"test_value_basic","value");
      abort();
    }
    bson_value_copy(local_c0,local_e0);
    uVar7 = bson_iter_key(local_180);
    bVar2 = bson_append_value(&local_280,uVar7,0xffffffff,local_e0);
    if ((bVar2 & 1) == 0) break;
    bson_value_destroy(local_e0);
    local_388 = local_388 + 1;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c",
          0x5e,"test_value_basic","r");
  abort();
}

Assistant:

static void
test_value_basic (void)
{
   static const uint8_t raw[16] = {0};
   const bson_value_t *value;
   bson_value_t copy;
   bson_iter_t iter;
   bson_oid_t oid;
   bson_t other = BSON_INITIALIZER;
   bson_t *doc;
   bson_t sub = BSON_INITIALIZER;
   bool r;
   int i;

   bson_oid_init (&oid, NULL);

   doc = BCON_NEW ("double",
                   BCON_DOUBLE (123.4),
                   "utf8",
                   "this is my string",
                   "document",
                   BCON_DOCUMENT (&sub),
                   "array",
                   BCON_DOCUMENT (&sub),
                   "binary",
                   BCON_BIN (BSON_SUBTYPE_BINARY, raw, sizeof raw),
                   "undefined",
                   BCON_UNDEFINED,
                   "oid",
                   BCON_OID (&oid),
                   "bool",
                   BCON_BOOL (true),
                   "datetime",
                   BCON_DATE_TIME (12345678),
                   "null",
                   BCON_NULL,
                   "regex",
                   BCON_REGEX ("^hello", "i"),
                   "dbpointer",
                   BCON_DBPOINTER ("test.test", &oid),
                   "code",
                   BCON_CODE ("var a = function() {}"),
                   "symbol",
                   BCON_SYMBOL ("my_symbol"),
                   "codewscope",
                   BCON_CODEWSCOPE ("var a = 1;", &sub),
                   "int32",
                   BCON_INT32 (1234),
                   "timestamp",
                   BCON_TIMESTAMP (1234, 4567),
                   "int64",
                   BCON_INT32 (4321),
                   "maxkey",
                   BCON_MAXKEY,
                   "minkey",
                   BCON_MINKEY);

   r = bson_iter_init (&iter, doc);
   BSON_ASSERT (r);

   for (i = 0; i < 20; i++) {
      r = bson_iter_next (&iter);
      BSON_ASSERT (r);

      value = bson_iter_value (&iter);
      BSON_ASSERT (value);

      bson_value_copy (value, &copy);

      r = bson_append_value (&other, bson_iter_key (&iter), -1, &copy);
      BSON_ASSERT (r);

      bson_value_destroy (&copy);
   }

   r = bson_iter_next (&iter);
   BSON_ASSERT (!r);

   bson_destroy (doc);
   bson_destroy (&other);
}